

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

deUint32 tcu::anon_unknown_0::EtcDecompressInternal::getBits(deUint64 src,int low,int high)

{
  int iVar1;
  int numBits;
  int high_local;
  int low_local;
  deUint64 src_local;
  
  iVar1 = (high - low) + 1;
  if (iVar1 < 0x20) {
    src_local._4_4_ = (uint)(src >> ((byte)low & 0x3f)) & (1 << ((byte)iVar1 & 0x1f)) - 1U;
  }
  else {
    src_local._4_4_ = (uint)(src >> ((byte)low & 0x3f));
  }
  return src_local._4_4_;
}

Assistant:

inline deUint32 getBits (deUint64 src, int low, int high)
{
	const int numBits = (high-low) + 1;
	DE_ASSERT(de::inRange(numBits, 1, 32));
	if (numBits < 32)
		return (deUint32)((src >> low) & ((1u<<numBits)-1));
	else
		return (deUint32)((src >> low) & 0xFFFFFFFFu);
}